

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorLink.c
# Opt level: O2

int ExorLinkCubeIteratorStart(Cube **pGroup,Cube *pC1,Cube *pC2,cubedist Dist)

{
  int iVar1;
  int iVar2;
  Cube *pCVar3;
  Cube *pCVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  int *piVar8;
  Cube *pCVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  drow *pdVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  int (*paiVar20) [4];
  uint uVar21;
  int (*paiVar22) [3];
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  
  if (pC1 == (Cube *)0x0) {
    __assert_fail("pC1 != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorLink.c"
                  ,0x180,"int ExorLinkCubeIteratorStart(Cube **, Cube *, Cube *, cubedist)");
  }
  if (pC2 != (Cube *)0x0) {
    if (fWorking != '\x01') {
      nCubes = Dist + DIST4;
      nCubesInGroup = s_ELnCubes[(int)Dist];
      nGroups = s_ELnGroups[Dist];
      nDist = Dist;
      pCA = pC1;
      pCB = pC2;
      uVar6 = FindDiffVars(DiffVars,pC1,pC2);
      pCVar9 = pCA;
      iVar2 = nCubes;
      iVar7 = 0;
      if (nCubes == uVar6) {
        uVar12 = 0;
        uVar18 = (ulong)(uint)g_CoverInfo.nWordsIn;
        if (g_CoverInfo.nWordsIn < 1) {
          uVar18 = uVar12;
        }
        for (; uVar18 * 4 != uVar12; uVar12 = uVar12 + 4) {
          *(undefined4 *)((long)DammyBitData + uVar12) =
               *(undefined4 *)((long)pCVar9->pCubeDataIn + uVar12);
        }
        nDiffVarsIn = (DiffVars[0] >> 0x1f) + uVar6;
        piVar8 = DiffVars + 1;
        if (-1 < DiffVars[0]) {
          piVar8 = DiffVars;
        }
        uVar12 = 0;
        uVar18 = (ulong)(uint)nDiffVarsIn;
        if (nDiffVarsIn < 1) {
          uVar18 = uVar12;
        }
        pDiffVars = piVar8;
        for (; pCVar3 = pCB, uVar18 * 4 != uVar12; uVar12 = uVar12 + 4) {
          iVar7 = *(int *)((long)piVar8 + uVar12);
          uVar11 = iVar7 * 2 & 0x1e;
          *(uint *)((long)DiffVarBits + uVar12) = uVar11;
          iVar7 = iVar7 >> 4;
          *(int *)((long)DiffVarWords + uVar12) = iVar7;
          DammyBitData[iVar7] = DammyBitData[iVar7] & ~(3 << (sbyte)uVar11);
        }
        iVar7 = (int)pCVar9->a;
        piVar8 = DiffVarValues[0] + 2;
        uVar11 = 0;
        StartingLiterals = iVar7;
        for (uVar12 = 0; uVar18 * 4 != uVar12; uVar12 = uVar12 + 4) {
          iVar1 = *(int *)((long)DiffVarWords + uVar12);
          bVar10 = (byte)*(undefined4 *)((long)DiffVarBits + uVar12);
          uVar17 = pCVar9->pCubeDataIn[iVar1] >> (bVar10 & 0x1f) & 3;
          (*(int (*) [3])(piVar8 + -2))[0] = uVar17;
          if (uVar17 != 3) {
            uVar11 = uVar11 | 1 << ((uint)uVar12 & 0x1f);
            iVar7 = iVar7 + -1;
            StartingLiterals = iVar7;
          }
          uVar24 = pCVar3->pCubeDataIn[iVar1] >> (bVar10 & 0x1f) & 3;
          piVar8[-1] = uVar24;
          uVar21 = 0;
          if (uVar24 != 3) {
            uVar21 = 2 << ((byte)uVar12 & 0x1f);
          }
          *piVar8 = uVar17 ^ uVar24;
          uVar25 = 0;
          if ((uVar17 ^ uVar24) != 3) {
            uVar25 = 4 << ((byte)uVar12 & 0x1f);
          }
          uVar11 = uVar11 | uVar21 | uVar25;
          piVar8 = piVar8 + 3;
        }
        uVar12 = 0;
        uVar18 = (ulong)(uint)nCubesInGroup;
        if (nCubesInGroup < 1) {
          uVar18 = uVar12;
        }
        for (; uVar18 * 4 != uVar12; uVar12 = uVar12 + 4) {
          *(uint *)((long)CubeLiterals + uVar12) =
               (uint)BitCount[*(uint *)((long)s_CubeLitMasks[Dist] + uVar12) & uVar11];
        }
        uVar18 = 0;
        uVar12 = 0;
        if (0 < (int)uVar6) {
          uVar12 = (ulong)uVar6;
        }
        uVar13 = (ulong)(uint)nGroups;
        if (nGroups < 1) {
          uVar13 = uVar18;
        }
        paiVar20 = s_ELGroupRules[Dist];
        piVar8 = GroupCosts;
        for (; uVar18 != uVar13; uVar18 = uVar18 + 1) {
          GroupCosts[uVar18] = 0;
          iVar7 = 0;
          for (uVar23 = 0; uVar12 != uVar23; uVar23 = uVar23 + 1) {
            iVar7 = iVar7 + CubeLiterals[(*(int (*) [4])*paiVar20)[uVar23]];
            GroupCosts[uVar18] = iVar7;
          }
          paiVar20 = paiVar20 + 1;
        }
        iVar7 = -1;
        for (uVar18 = 0; uVar13 != uVar18; uVar18 = uVar18 + 1) {
          if (iVar7 < *piVar8) {
            GroupCostBestNum = (int)uVar18;
            iVar7 = *piVar8;
          }
          piVar8 = piVar8 + 1;
        }
        LastGroup = 0;
        lVar16 = 0;
        uVar11 = uVar6;
        while( true ) {
          if ((int)uVar11 <= lVar16) break;
          CubeNum = s_ELGroupRules[Dist][GroupCostBestNum][lVar16];
          LastGroup = LastGroup | s_BitMasks[CubeNum];
          pCVar9 = GetFreeCube();
          lVar15 = (long)CubeNum;
          ELCubes[lVar15] = pCVar9;
          pdVar14 = DammyBitData;
          for (lVar19 = 0; uVar11 = nDiffVarsIn, pCVar4 = pCB, pCVar3 = pCA,
              lVar19 < g_CoverInfo.nWordsIn; lVar19 = lVar19 + 1) {
            pCVar9->pCubeDataIn[lVar19] = *pdVar14;
            pdVar14 = pdVar14 + 1;
          }
          NewZ = 0;
          if (DiffVars[0] < 0) {
            iVar7 = s_ELCubeRules[Dist][lVar15][nDiffVarsIn];
            if (iVar7 == 0) {
              for (lVar19 = 0; lVar19 < g_CoverInfo.nWordsOut; lVar19 = lVar19 + 1) {
                uVar17 = pCVar3->pCubeDataOut[lVar19];
                pCVar9->pCubeDataOut[lVar19] = uVar17;
                NewZ = NewZ + (uint)BitCount[uVar17 >> 0x10] + (uint)BitCount[uVar17 & 0xffff];
              }
            }
            else if (iVar7 == 1) {
              for (lVar19 = 0; lVar19 < g_CoverInfo.nWordsOut; lVar19 = lVar19 + 1) {
                uVar17 = pCVar4->pCubeDataOut[lVar19];
                pCVar9->pCubeDataOut[lVar19] = uVar17;
                NewZ = NewZ + (uint)BitCount[uVar17 >> 0x10] + (uint)BitCount[uVar17 & 0xffff];
              }
            }
            else if (iVar7 == 2) {
              for (lVar19 = 0; lVar19 < g_CoverInfo.nWordsOut; lVar19 = lVar19 + 1) {
                uVar17 = pCVar4->pCubeDataOut[lVar19] ^ pCVar3->pCubeDataOut[lVar19];
                pCVar9->pCubeDataOut[lVar19] = uVar17;
                NewZ = NewZ + (uint)BitCount[uVar17 >> 0x10] + (uint)BitCount[uVar17 & 0xffff];
              }
            }
          }
          else {
            for (lVar19 = 0; lVar19 < g_CoverInfo.nWordsOut; lVar19 = lVar19 + 1) {
              pCVar9->pCubeDataOut[lVar19] = pCVar3->pCubeDataOut[lVar19];
            }
            NewZ = (int)pCVar3->z;
            uVar11 = nDiffVarsIn;
          }
          iVar7 = NewZ;
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          paiVar22 = DiffVarValues;
          for (lVar19 = 0; (ulong)uVar11 * 4 != lVar19; lVar19 = lVar19 + 4) {
            pCVar9->pCubeDataIn[*(int *)((long)DiffVarWords + lVar19)] =
                 pCVar9->pCubeDataIn[*(int *)((long)DiffVarWords + lVar19)] |
                 (*paiVar22)[*(int *)((long)s_ELCubeRules[Dist][lVar15] + lVar19)] <<
                 (*(byte *)((long)DiffVarBits + lVar19) & 0x1f);
            paiVar22 = paiVar22 + 1;
          }
          pCVar9->a = (short)CubeLiterals[lVar15] + (short)StartingLiterals;
          pCVar9->z = (short)iVar7;
          iVar7 = ComputeQCostBits(pCVar9);
          pCVar9 = ELCubes[CubeNum];
          pCVar9->q = (short)iVar7;
          iVar7 = g_CoverInfo.cIDs + 1;
          bVar5 = (byte)g_CoverInfo.cIDs;
          g_CoverInfo.cIDs = iVar7;
          pCVar9->ID = bVar5;
          if (iVar7 == 0x100) {
            g_CoverInfo.cIDs = 1;
          }
          pGroup[lVar16] = pCVar9;
          lVar16 = lVar16 + 1;
          uVar11 = nCubes;
        }
        VisitedGroups = VisitedGroups | s_BitMasks[GroupCostBestNum];
        GroupOrder[0] = GroupCostBestNum;
        nVisitedGroups = 1;
        iVar7 = 1;
      }
      fWorking = iVar2 == uVar6;
      return iVar7;
    }
    __assert_fail("!fWorking",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorLink.c"
                  ,0x182,"int ExorLinkCubeIteratorStart(Cube **, Cube *, Cube *, cubedist)");
  }
  __assert_fail("pC2 != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorLink.c"
                ,0x181,"int ExorLinkCubeIteratorStart(Cube **, Cube *, Cube *, cubedist)");
}

Assistant:

int ExorLinkCubeIteratorStart( Cube** pGroup, Cube* pC1, Cube* pC2, cubedist Dist )
// this function starts the Exor-Link iterator, which iterates
// through the cube groups starting from the group with min literals
// returns 1 on success, returns 0 if the cubes have wrong distance
{
    int i, c;

    // check that everything is okey
    assert( pC1 != NULL );
    assert( pC2 != NULL );
    assert( !fWorking );

    nDist = Dist;
    nCubes = Dist + 2;
    nCubesInGroup = s_ELnCubes[nDist];
    nGroups = s_ELnGroups[Dist];
    pCA = pC1;
    pCB = pC2;
    // find what variables are different in these two cubes
    // FindDiffVars returns DiffVars[0] < 0, if the output is different
    nDifferentVars = FindDiffVars( DiffVars, pCA, pCB );
    if ( nCubes != nDifferentVars )
    {
//      cout << "ExorLinkCubeIterator(): Distance mismatch";
//      cout << " nCubes = " << nCubes << " nDiffVars = " << nDifferentVars << endl;
        fWorking = 0;
        return 0;
    }

    // copy the input variable cube data into DammyBitData[]
    for ( i = 0; i < g_CoverInfo.nWordsIn; i++ )
        DammyBitData[i] = pCA->pCubeDataIn[i];

    // find the number of different input variables
    nDiffVarsIn = ( DiffVars[0] >= 0 )? nCubes: nCubes-1;
    // assign the pointer to the place where the number of diff input vars is stored
    pDiffVars   = ( DiffVars[0] >= 0 )? DiffVars: DiffVars+1;
    // find the bit offsets and remove different variables
    for ( i = 0; i < nDiffVarsIn; i++ )
    {
        DiffVarWords[i] = ((2*pDiffVars[i]) >> LOGBPI) ;
        DiffVarBits[i]  = ((2*pDiffVars[i]) & BPIMASK);
        // clear this position
        DammyBitData[ DiffVarWords[i] ] &= ~( 3 << DiffVarBits[i] );
    }

    // extract the values from the cubes and create the mask of literals
    MaskLiterals = 0;
    // initialize the base for literal counts
    StartingLiterals = pCA->a;
    for ( i = 0, BitShift = 0; i < nDiffVarsIn; i++, BitShift++ )
    {
        DiffVarValues[i][0] = ( pCA->pCubeDataIn[DiffVarWords[i]] >> DiffVarBits[i] ) & 3;
        if ( DiffVarValues[i][0] != VAR_ABS )
        {
            MaskLiterals |= ( 1 << BitShift );
            // update the base for literal counts
            StartingLiterals--;
        }
        BitShift++;

        DiffVarValues[i][1] = ( pCB->pCubeDataIn[DiffVarWords[i]] >> DiffVarBits[i] ) & 3;
        if ( DiffVarValues[i][1] != VAR_ABS )
            MaskLiterals |= ( 1 << BitShift );
        BitShift++;

        DiffVarValues[i][2] = DiffVarValues[i][0] ^ DiffVarValues[i][1];
        if ( DiffVarValues[i][2] != VAR_ABS )
            MaskLiterals |= ( 1 << BitShift );
        BitShift++;
    }

    // count the number of additional literals in each cube of the group
    for ( i = 0; i < nCubesInGroup; i++ )
        CubeLiterals[i] = BitCount[ MaskLiterals & s_CubeLitMasks[Dist][i] ];

    // compute the costs of all groups
    for ( i = 0; i < nGroups; i++ )
        // go over all cubes in the group
        for ( GroupCosts[i] = 0, c = 0; c < nCubes; c++ )
            GroupCosts[i] += CubeLiterals[ s_ELGroupRules[Dist][i][c] ];

    // find the best cost group
    if ( fMinLitGroupsFirst[Dist] ) 
    { // find the minimum cost group
        GroupCostBest = LARGE_NUM;
        for ( i = 0; i < nGroups; i++ )
            if ( GroupCostBest > GroupCosts[i] )
            {
                GroupCostBest = GroupCosts[i];
                GroupCostBestNum = i;
            }
    }
    else 
    { // find the maximum cost group
        GroupCostBest = -1;
        for ( i = 0; i < nGroups; i++ )
            if ( GroupCostBest < GroupCosts[i] )
            {
                GroupCostBest = GroupCosts[i];
                GroupCostBestNum = i;
            }
    }

    // create the cubes with min number of literals needed for the group
    LastGroup = 0;
    for ( c = 0; c < nCubes; c++ )
    {
        CubeNum = s_ELGroupRules[Dist][GroupCostBestNum][c];
        LastGroup |= s_BitMasks[CubeNum];

        // bring a cube from the free cube list
        ELCubes[CubeNum] = GetFreeCube();

        // copy the input bit data into the cube 
        for ( i = 0; i < g_CoverInfo.nWordsIn; i++ )
            ELCubes[CubeNum]->pCubeDataIn[i] = DammyBitData[i];

        // copy the output bit data into the cube
        NewZ = 0;
        if ( DiffVars[0] >= 0 ) // the output is not involved in ExorLink
        {
            for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                ELCubes[CubeNum]->pCubeDataOut[i] = pCA->pCubeDataOut[i];
            NewZ = pCA->z;
        }
        else // the output is involved
        { // determine where the output information comes from
            Value = s_ELCubeRules[Dist][CubeNum][nDiffVarsIn];
            if ( Value == vs0 )
                for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                {
                    Temp = pCA->pCubeDataOut[i];
                    ELCubes[CubeNum]->pCubeDataOut[i] = Temp;
                    NewZ += BIT_COUNT(Temp);
                }
            else if ( Value == vs1 )
                for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                {
                    Temp = pCB->pCubeDataOut[i];
                    ELCubes[CubeNum]->pCubeDataOut[i] = Temp;
                    NewZ += BIT_COUNT(Temp);
                }
            else if ( Value == vsX )
                for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                {
                    Temp = pCA->pCubeDataOut[i] ^ pCB->pCubeDataOut[i];
                    ELCubes[CubeNum]->pCubeDataOut[i] = Temp;
                    NewZ += BIT_COUNT(Temp);
                }
        }

        // set the variables that should be there
        for ( i = 0; i < nDiffVarsIn; i++ )
        {
            Value = DiffVarValues[i][ s_ELCubeRules[Dist][CubeNum][i] ];
            ELCubes[CubeNum]->pCubeDataIn[ DiffVarWords[i] ] |= ( Value << DiffVarBits[i] );
        }

        // set the number of literals
        ELCubes[CubeNum]->a = StartingLiterals + CubeLiterals[CubeNum];
        ELCubes[CubeNum]->z = NewZ;
        ELCubes[CubeNum]->q = ComputeQCostBits( ELCubes[CubeNum] );

        // assign the ID
        ELCubes[CubeNum]->ID = g_CoverInfo.cIDs++;
        // skip through zero-ID
        if ( g_CoverInfo.cIDs == 256 )
            g_CoverInfo.cIDs = 1;

        // prepare the return array
        pGroup[c] = ELCubes[CubeNum];
    }

    // mark this group as visited 
    VisitedGroups |= s_BitMasks[ GroupCostBestNum ];
    // set the first visited group number
    GroupOrder[0] = GroupCostBestNum;
    // increment the counter of visited groups
    nVisitedGroups = 1;
    fWorking = 1;
    return 1;
}